

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

int Acb_NtkComputePaths(Acb_Ntk_t *p)

{
  int iVar1;
  Vec_Int_t *vTfi_00;
  Vec_Int_t *vTfo_00;
  Vec_Int_t *vTfo;
  Vec_Int_t *vTfi;
  int LevelR;
  int LevelD;
  Acb_Ntk_t *p_local;
  
  vTfi_00 = Acb_ObjCollectTfi(p,-1,1);
  vTfo_00 = Acb_ObjCollectTfo(p,-1,1);
  Acb_NtkComputeLevelD(p,vTfo_00);
  iVar1 = p->LevelMax;
  Acb_NtkComputeLevelR(p,vTfi_00);
  if (iVar1 == p->LevelMax) {
    Acb_NtkComputePathsD(p,vTfo_00,1);
    Acb_NtkComputePathsR(p,vTfi_00,1);
    return p->nPaths;
  }
  __assert_fail("LevelD == LevelR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbUtil.c"
                ,0x1ab,"int Acb_NtkComputePaths(Acb_Ntk_t *)");
}

Assistant:

int Acb_NtkComputePaths( Acb_Ntk_t * p )
{
    int LevelD, LevelR;
    Vec_Int_t * vTfi = Acb_ObjCollectTfi( p, -1, 1 );
    Vec_Int_t * vTfo = Acb_ObjCollectTfo( p, -1, 1 );
    Acb_NtkComputeLevelD( p, vTfo );
    LevelD = p->LevelMax;
    Acb_NtkComputeLevelR( p, vTfi );
    LevelR = p->LevelMax;
    assert( LevelD == LevelR );
    Acb_NtkComputePathsD( p, vTfo, 1 );
    Acb_NtkComputePathsR( p, vTfi, 1 );
    return p->nPaths;
}